

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode JsConvertValueToObject(JsValueRef value,JsValueRef *result)

{
  ScriptContext *scriptContext;
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  JsrtContext *pJVar5;
  RecyclableObject *pRVar6;
  undefined4 *puVar7;
  JsErrorCode exitStatus;
  void *unaff_retaddr;
  undefined1 auStack_98 [8];
  ScriptEntryExitRecord __entryExitRecord;
  EnterScriptObject __enterScriptObject;
  TTDRecorder _actionEntryPopper;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  __enterScriptObject.library = (JavascriptLibrary *)0x0;
  _actionEntryPopper.m_actionEvent = (EventLogEntry *)0x0;
  pJVar5 = JsrtContext::GetCurrent();
  if (pJVar5 == (JsrtContext *)0x0) {
    exitStatus = JsErrorNoCurrentContext;
    goto LAB_00362de0;
  }
  scriptContext = (((pJVar5->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr
  ;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)((long)&_actionEntryPopper.m_resultPtr + 4),
             ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
  __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
  __entryExitRecord.scriptContext = (ScriptContext *)0x0;
  __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
  __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
  __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
  auStack_98 = (undefined1  [8])0x0;
  __entryExitRecord._0_1_ = 0;
  __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
  __entryExitRecord._2_6_ = 0;
  Js::EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType,scriptContext,
             (ScriptEntryExitRecord *)auStack_98,unaff_retaddr,&stack0x00000000,true,true,true);
  Js::ScriptContext::OnScriptStart(scriptContext,true,true);
  Js::EnterScriptObject::VerifyEnterScript
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
  if (scriptContext->TTDShouldPerformRecordAction == true) {
    TTD::EventLog::RecordJsRTVarToObjectConversion
              (scriptContext->threadContext->TTDLog,
               (TTDJsRTActionResultAutoRecorder *)&__enterScriptObject.library,value);
  }
  if (value == (JsValueRef)0x0) {
    exitStatus = JsErrorInvalidArgument;
  }
  else {
    if ((ulong)value >> 0x30 == 0) {
      pRVar6 = Js::VarTo<Js::RecyclableObject>(value);
      pSVar1 = (((((pRVar6->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar1 != scriptContext) {
        exitStatus = JsErrorWrongRuntime;
        if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_00362dce;
        value = Js::CrossSite::MarshalVar(scriptContext,pRVar6,false);
      }
    }
    if (result == (JsValueRef *)0x0) {
      exitStatus = JsErrorNullArgument;
    }
    else {
      pRVar6 = Js::JavascriptOperators::ToObject(value,scriptContext);
      *result = pRVar6;
      if (pRVar6 != (RecyclableObject *)0x0) {
        BVar4 = Js::CrossSite::NeedMarshalVar(pRVar6,scriptContext);
        if (BVar4 != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar7 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                             ,0x55e,
                             "(*result == nullptr || !Js::CrossSite::NeedMarshalVar(*result, scriptContext))"
                             ,
                             "*result == nullptr || !Js::CrossSite::NeedMarshalVar(*result, scriptContext)"
                            );
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar7 = 0;
        }
      }
      exitStatus = JsNoError;
      if (scriptContext->TTDShouldPerformRecordAction == true) {
        TTD::TTDJsRTActionResultAutoRecorder::SetResult
                  ((TTDJsRTActionResultAutoRecorder *)&__enterScriptObject.library,result);
        exitStatus = JsNoError;
      }
    }
  }
LAB_00362dce:
  Js::EnterScriptObject::~EnterScriptObject
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)((long)&_actionEntryPopper.m_resultPtr + 4));
LAB_00362de0:
  TTD::TTDJsRTActionResultAutoRecorder::CompleteWithStatusCode
            ((TTDJsRTActionResultAutoRecorder *)&__enterScriptObject.library,exitStatus);
  return exitStatus;
}

Assistant:

CHAKRA_API JsConvertValueToObject(_In_ JsValueRef value, _Out_ JsValueRef *result)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&] (Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTVarToObjectConversion, (Js::Var)value);

        VALIDATE_INCOMING_REFERENCE(value, scriptContext);
        PARAM_NOT_NULL(result);

        *result = (JsValueRef)Js::JavascriptOperators::ToObject((Js::Var)value, scriptContext);
        Assert(*result == nullptr || !Js::CrossSite::NeedMarshalVar(*result, scriptContext));

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, result);

        return JsNoError;
    });
}